

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeDereference(ExpressionContext *ctx,SynDereference *syntax)

{
  uint uVar1;
  TypeStruct *pTVar2;
  _func_int **pp_Var3;
  int iVar4;
  ExprBase *pEVar5;
  undefined4 extraout_var;
  TypeBase *pTVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined **ppuVar8;
  ulong uVar9;
  char *msg;
  ExprBase *pEVar6;
  
  pEVar5 = AnalyzeExpression(ctx,syntax->value);
  pTVar7 = pEVar5->type;
  uVar1 = pTVar7->typeID;
  if (uVar1 == 0x12) {
    pp_Var3 = pTVar7[1]._vptr_TypeBase;
    if (pp_Var3 != (_func_int **)0x0) {
      if (*(int *)(pp_Var3 + 1) == 0x18) {
        if (*(char *)(pp_Var3 + 0x24) == '\0') {
          uVar9 = (ulong)(uint)(*(int *)(pp_Var3 + 3) - (int)pp_Var3[2]);
          msg = "ERROR: type \'%.*s\' is not fully defined";
          goto LAB_001cdfb4;
        }
      }
      else if (*(int *)(pp_Var3 + 1) == 1) {
        uVar9 = (ulong)(uint)(*(int *)&(pTVar7->name).end - (int)(pTVar7->name).begin);
        msg = "ERROR: cannot dereference type \'%.*s\'";
LAB_001cdfb4:
        anon_unknown.dwarf_ff84f::Stop(ctx,&syntax->super_SynBase,msg,uVar9);
      }
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var_01,iVar4);
    pTVar7 = (TypeBase *)pTVar7[1]._vptr_TypeBase;
  }
  else {
    if (uVar1 == 0x10) {
      if (pEVar5->typeID == 0x17) {
        anon_unknown.dwarf_ff84f::Stop
                  (ctx,&syntax->super_SynBase,"ERROR: cannot dereference value of unknown type");
      }
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pEVar6 = (ExprBase *)CONCAT44(extraout_var_00,iVar4);
      pTVar2 = ctx->typeAutoRef;
      pEVar6->typeID = 0x17;
      pEVar6->source = &syntax->super_SynBase;
      pEVar6->type = &pTVar2->super_TypeBase;
      pEVar6->next = (ExprBase *)0x0;
      pEVar6->listed = false;
      ppuVar8 = &PTR__ExprBase_003e3868;
      goto LAB_001cdf65;
    }
    if (uVar1 != 0) {
      uVar9 = (ulong)(uint)(*(int *)&(pTVar7->name).end - (int)(pTVar7->name).begin);
      msg = "ERROR: cannot dereference type \'%.*s\' that is not a pointer";
      goto LAB_001cdfb4;
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar4);
    pTVar7 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
  }
  pEVar6->typeID = 0x16;
  pEVar6->source = &syntax->super_SynBase;
  pEVar6->type = pTVar7;
  pEVar6->next = (ExprBase *)0x0;
  pEVar6->listed = false;
  ppuVar8 = &PTR__ExprBase_003e3520;
LAB_001cdf65:
  pEVar6->_vptr_ExprBase = (_func_int **)ppuVar8;
  pEVar6[1]._vptr_ExprBase = (_func_int **)pEVar5;
  return pEVar6;
}

Assistant:

ExprBase* AnalyzeDereference(ExpressionContext &ctx, SynDereference *syntax)
{
	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprDereference>()) ExprDereference(syntax, ctx.GetErrorType(), value);

	if(TypeRef *type = getType<TypeRef>(value->type))
	{
		if(isType<TypeVoid>(type->subType))
			Stop(ctx, syntax, "ERROR: cannot dereference type '%.*s'", FMT_ISTR(value->type->name));

		if(TypeClass *typeClass = getType<TypeClass>(type->subType))
		{
			if(!typeClass->completed)
				Stop(ctx, syntax, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(typeClass->name));
		}

		return new (ctx.get<ExprDereference>()) ExprDereference(syntax, type->subType, value);
	}

	if(isType<TypeAutoRef>(value->type))
	{
		if(isType<ExprUnboxing>(value))
			Stop(ctx, syntax, "ERROR: cannot dereference value of unknown type");

		return new (ctx.get<ExprUnboxing>()) ExprUnboxing(syntax, ctx.typeAutoRef, value);
	}

	Stop(ctx, syntax, "ERROR: cannot dereference type '%.*s' that is not a pointer", FMT_ISTR(value->type->name));

	return NULL;
}